

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O0

int __thiscall sparse_tree::B(sparse_tree *this,int l,int j)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  reference piVar4;
  int in_EDX;
  int in_ESI;
  vector<Node,_std::allocator<Node>_> *in_RDI;
  int x;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int lca;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffd0;
  sparse_tree *in_stack_ffffffffffffffd8;
  int local_4;
  
  pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RDI,(long)in_ESI);
  if ((pvVar3->parent->index == 0) ||
     (pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RDI,(long)in_ESI),
     -1 < pvVar3->pair)) {
    local_4 = -2;
  }
  else {
    pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RDI,(long)in_ESI);
    if (in_EDX < pvVar3->parent->pair) {
      local_4 = -1;
    }
    else {
      iVar2 = LCA(in_stack_ffffffffffffffd8,
                  (int)((ulong)in_stack_ffffffffffffffd0._M_current >> 0x20),
                  (int)in_stack_ffffffffffffffd0._M_current);
      local_4 = in_EDX;
      if (in_EDX != iVar2) {
        std::vector<Node,_std::allocator<Node>_>::operator[](in_RDI,(long)iVar2);
        std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)in_RDI);
        std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                  (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_RDI), bVar1) {
          piVar4 = __gnu_cxx::
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&stack0xffffffffffffffd0);
          in_stack_ffffffffffffffc4 = *piVar4;
          if ((in_stack_ffffffffffffffc4 < in_EDX) &&
             (pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[]
                                 (in_RDI,(long)in_stack_ffffffffffffffc4), in_ESI < pvVar3->pair)) {
            pvVar3 = std::vector<Node,_std::allocator<Node>_>::operator[]
                               (in_RDI,(long)in_stack_ffffffffffffffc4);
            return pvVar3->pair;
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &stack0xffffffffffffffd0);
        }
        local_4 = -100;
      }
    }
  }
  return local_4;
}

Assistant:

const int sparse_tree::B(int l, int j) const{
    if(tree[l].parent->index == 0 || tree[l].pair > -1) return -2;
    if ((tree[l].parent)->pair > j) return -1;
    else{
        int lca = LCA(l,j);
        if(j == lca) return j;
        for(int x:tree[lca].children){
            if(x<j && tree[x].pair > l) return tree[x].pair;
        }
        return -100;
    }
}